

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O0

_Bool al_init_image_addon(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  int success;
  _Bool local_1;
  
  if (iio_inited) {
    local_1 = true;
  }
  else {
    bVar1 = al_register_bitmap_loader(".pcx",_al_load_pcx);
    bVar2 = al_register_bitmap_saver(".pcx",_al_save_pcx);
    bVar3 = al_register_bitmap_loader_f(".pcx",_al_load_pcx_f);
    bVar4 = al_register_bitmap_saver_f(".pcx",_al_save_pcx_f);
    bVar5 = al_register_bitmap_identifier(".pcx",_al_identify_pcx);
    bVar6 = al_register_bitmap_loader(".bmp",_al_load_bmp);
    bVar7 = al_register_bitmap_saver(".bmp",_al_save_bmp);
    bVar8 = al_register_bitmap_loader_f(".bmp",_al_load_bmp_f);
    bVar9 = al_register_bitmap_saver_f(".bmp",_al_save_bmp_f);
    bVar10 = al_register_bitmap_identifier(".bmp",_al_identify_bmp);
    bVar11 = al_register_bitmap_loader(".tga",_al_load_tga);
    bVar12 = al_register_bitmap_saver(".tga",_al_save_tga);
    bVar13 = al_register_bitmap_loader_f(".tga",_al_load_tga_f);
    bVar14 = al_register_bitmap_saver_f(".tga",_al_save_tga_f);
    bVar15 = al_register_bitmap_identifier(".tga",_al_identify_tga);
    bVar16 = al_register_bitmap_loader(".dds",_al_load_dds);
    bVar17 = al_register_bitmap_loader_f(".dds",_al_load_dds_f);
    bVar18 = al_register_bitmap_identifier(".dds",_al_identify_dds);
    bVar19 = al_register_bitmap_identifier(".png",_al_identify_png);
    bVar20 = al_register_bitmap_identifier(".jpg",_al_identify_jpg);
    bVar21 = al_register_bitmap_loader(".png",_al_load_png);
    bVar22 = al_register_bitmap_saver(".png",_al_save_png);
    bVar23 = al_register_bitmap_loader_f(".png",_al_load_png_f);
    bVar24 = al_register_bitmap_saver_f(".png",_al_save_png_f);
    bVar25 = al_register_bitmap_loader(".jpg",_al_load_jpg);
    bVar26 = al_register_bitmap_saver(".jpg",_al_save_jpg);
    bVar27 = al_register_bitmap_loader_f(".jpg",_al_load_jpg_f);
    bVar28 = al_register_bitmap_saver_f(".jpg",_al_save_jpg_f);
    bVar29 = al_register_bitmap_loader(".jpeg",_al_load_jpg);
    bVar30 = al_register_bitmap_saver(".jpeg",_al_save_jpg);
    bVar31 = al_register_bitmap_loader_f(".jpeg",_al_load_jpg_f);
    bVar32 = al_register_bitmap_saver_f(".jpeg",_al_save_jpg_f);
    bVar33 = al_register_bitmap_loader(".webp",_al_load_webp);
    bVar34 = al_register_bitmap_saver(".webp",_al_save_webp);
    bVar35 = al_register_bitmap_loader_f(".webp",_al_load_webp_f);
    bVar36 = al_register_bitmap_saver_f(".webp",_al_save_webp_f);
    bVar37 = al_register_bitmap_identifier(".webp",_al_identify_webp);
    if ((bVar37 & 1) != 0 ||
        ((bVar36 & 1) != 0 ||
        ((bVar35 & 1) != 0 ||
        ((bVar34 & 1) != 0 ||
        ((bVar33 & 1) != 0 ||
        ((bVar32 & 1) != 0 ||
        ((bVar31 & 1) != 0 ||
        ((bVar30 & 1) != 0 ||
        ((bVar29 & 1) != 0 ||
        ((bVar28 & 1) != 0 ||
        ((bVar27 & 1) != 0 ||
        ((bVar26 & 1) != 0 ||
        ((bVar25 & 1) != 0 ||
        ((bVar24 & 1) != 0 ||
        ((bVar23 & 1) != 0 ||
        ((bVar22 & 1) != 0 ||
        ((bVar21 & 1) != 0 ||
        ((bVar20 & 1) != 0 ||
        ((bVar19 & 1) != 0 ||
        ((bVar18 & 1) != 0 ||
        ((bVar17 & 1) != 0 ||
        ((bVar16 & 1) != 0 ||
        ((bVar15 & 1) != 0 ||
        ((bVar14 & 1) != 0 ||
        ((bVar13 & 1) != 0 ||
        ((bVar12 & 1) != 0 ||
        ((bVar11 & 1) != 0 ||
        ((bVar10 & 1) != 0 ||
        ((bVar9 & 1) != 0 ||
        ((bVar8 & 1) != 0 ||
        ((bVar7 & 1) != 0 ||
        ((bVar6 & 1) != 0 ||
        ((bVar5 & 1) != 0 ||
        ((bVar4 & 1) != 0 || ((bVar3 & 1) != 0 || ((bVar2 & 1) != 0 || (bVar1 & 1) != 0)))))))))))))
        ))))))))))))))))))))))) {
      iio_inited = true;
    }
    _al_add_exit_func(al_shutdown_image_addon,"al_shutdown_image_addon");
    local_1 = (bVar37 & 1) != 0 ||
              ((bVar36 & 1) != 0 ||
              ((bVar35 & 1) != 0 ||
              ((bVar34 & 1) != 0 ||
              ((bVar33 & 1) != 0 ||
              ((bVar32 & 1) != 0 ||
              ((bVar31 & 1) != 0 ||
              ((bVar30 & 1) != 0 ||
              ((bVar29 & 1) != 0 ||
              ((bVar28 & 1) != 0 ||
              ((bVar27 & 1) != 0 ||
              ((bVar26 & 1) != 0 ||
              ((bVar25 & 1) != 0 ||
              ((bVar24 & 1) != 0 ||
              ((bVar23 & 1) != 0 ||
              ((bVar22 & 1) != 0 ||
              ((bVar21 & 1) != 0 ||
              ((bVar20 & 1) != 0 ||
              ((bVar19 & 1) != 0 ||
              ((bVar18 & 1) != 0 ||
              ((bVar17 & 1) != 0 ||
              ((bVar16 & 1) != 0 ||
              ((bVar15 & 1) != 0 ||
              ((bVar14 & 1) != 0 ||
              ((bVar13 & 1) != 0 ||
              ((bVar12 & 1) != 0 ||
              ((bVar11 & 1) != 0 ||
              ((bVar10 & 1) != 0 ||
              ((bVar9 & 1) != 0 ||
              ((bVar8 & 1) != 0 ||
              ((bVar7 & 1) != 0 ||
              ((bVar6 & 1) != 0 ||
              ((bVar5 & 1) != 0 ||
              ((bVar4 & 1) != 0 || ((bVar3 & 1) != 0 || ((bVar2 & 1) != 0 || (bVar1 & 1) != 0)))))))
              ))))))))))))))))))))))))))));
  }
  return local_1;
}

Assistant:

bool al_init_image_addon(void)
{
   int success;

   if (iio_inited)
      return true;

   success = 0;

   success |= al_register_bitmap_loader(".pcx", _al_load_pcx);
   success |= al_register_bitmap_saver(".pcx", _al_save_pcx);
   success |= al_register_bitmap_loader_f(".pcx", _al_load_pcx_f);
   success |= al_register_bitmap_saver_f(".pcx", _al_save_pcx_f);
   success |= al_register_bitmap_identifier(".pcx", _al_identify_pcx);

   success |= al_register_bitmap_loader(".bmp", _al_load_bmp);
   success |= al_register_bitmap_saver(".bmp", _al_save_bmp);
   success |= al_register_bitmap_loader_f(".bmp", _al_load_bmp_f);
   success |= al_register_bitmap_saver_f(".bmp", _al_save_bmp_f);
   success |= al_register_bitmap_identifier(".bmp", _al_identify_bmp);

   success |= al_register_bitmap_loader(".tga", _al_load_tga);
   success |= al_register_bitmap_saver(".tga", _al_save_tga);
   success |= al_register_bitmap_loader_f(".tga", _al_load_tga_f);
   success |= al_register_bitmap_saver_f(".tga", _al_save_tga_f);
   success |= al_register_bitmap_identifier(".tga", _al_identify_tga);

   success |= al_register_bitmap_loader(".dds", _al_load_dds);
   success |= al_register_bitmap_loader_f(".dds", _al_load_dds_f);
   success |= al_register_bitmap_identifier(".dds", _al_identify_dds);

   /* Even if we don't have libpng or libjpeg we most likely have a
    * native reader for those instead so always identify them.
    */
   success |= al_register_bitmap_identifier(".png", _al_identify_png);
   success |= al_register_bitmap_identifier(".jpg", _al_identify_jpg);

/* ALLEGRO_CFG_IIO_HAVE_* is sufficient to know that the library
   should be used. i.e., ALLEGRO_CFG_IIO_HAVE_GDIPLUS and
   ALLEGRO_CFG_IIO_HAVE_PNG will never both be set. */

#ifdef ALLEGRO_CFG_IIO_HAVE_GDIPLUS
   {
      char const *extensions[] = {".tif", ".tiff", ".jpg", ".jpeg", ".gif",
         ".png", NULL};
      int i;

      if (_al_init_gdiplus()) {
         for (i = 0; extensions[i]; i++) {
            success |= al_register_bitmap_loader(extensions[i], _al_load_gdiplus_bitmap);
            success |= al_register_bitmap_loader_f(extensions[i], _al_load_gdiplus_bitmap_f);
            success |= al_register_bitmap_saver(extensions[i], _al_save_gdiplus_bitmap);
         }

         success |= al_register_bitmap_saver_f(".tif", _al_save_gdiplus_tif_f);
         success |= al_register_bitmap_saver_f(".tiff", _al_save_gdiplus_tif_f);
         success |= al_register_bitmap_saver_f(".gif", _al_save_gdiplus_gif_f);
         success |= al_register_bitmap_saver_f(".png", _al_save_gdiplus_png_f);
         success |= al_register_bitmap_saver_f(".jpg", _al_save_gdiplus_jpg_f);
         success |= al_register_bitmap_saver_f(".jpeg", _al_save_gdiplus_jpg_f);
      }
   }
#endif

#ifdef ALLEGRO_CFG_IIO_HAVE_PNG
   success |= al_register_bitmap_loader(".png", _al_load_png);
   success |= al_register_bitmap_saver(".png", _al_save_png);
   success |= al_register_bitmap_loader_f(".png", _al_load_png_f);
   success |= al_register_bitmap_saver_f(".png", _al_save_png_f);
#endif

#ifdef ALLEGRO_CFG_IIO_HAVE_JPG
   success |= al_register_bitmap_loader(".jpg", _al_load_jpg);
   success |= al_register_bitmap_saver(".jpg", _al_save_jpg);
   success |= al_register_bitmap_loader_f(".jpg", _al_load_jpg_f);
   success |= al_register_bitmap_saver_f(".jpg", _al_save_jpg_f);

   success |= al_register_bitmap_loader(".jpeg", _al_load_jpg);
   success |= al_register_bitmap_saver(".jpeg", _al_save_jpg);
   success |= al_register_bitmap_loader_f(".jpeg", _al_load_jpg_f);
   success |= al_register_bitmap_saver_f(".jpeg", _al_save_jpg_f);
#endif

#ifdef ALLEGRO_CFG_IIO_HAVE_WEBP
   success |= al_register_bitmap_loader(".webp", _al_load_webp);
   success |= al_register_bitmap_saver(".webp", _al_save_webp);
   success |= al_register_bitmap_loader_f(".webp", _al_load_webp_f);
   success |= al_register_bitmap_saver_f(".webp", _al_save_webp_f);
   success |= al_register_bitmap_identifier(".webp", _al_identify_webp);
#endif

#ifdef ALLEGRO_CFG_IIO_HAVE_FREEIMAGE
   {
      char const *extensions[] = {".ico", ".jng", ".koala", ".lbm",
         ".iff", ".mng", ".pbm", ".pcd", ".pgm", ".ppm", ".ras", ".wbmp",
         ".psd", ".cut", ".xpm", ".hdr", ".fax", ".sgi", ".exr", ".raw",
         ".j2k", ".jp2", ".jpf", ".jpm", ".jpx", ".mj2", ".pfm", ".pict",
         ".jxr", ".jbg", NULL};
      int i;

      if (_al_init_fi()) {
         for (i = 0; extensions[i]; i++) {
            success |= al_register_bitmap_loader(extensions[i], _al_load_fi_bitmap);
            success |= al_register_bitmap_loader_f(extensions[i], _al_load_fi_bitmap_f);
            success |= al_register_bitmap_identifier(extensions[i], _al_identify_fi);
         }
      }
   }
#endif

#ifdef ALLEGRO_CFG_IIO_HAVE_ANDROID
   {
      char const *extensions[] = {".webp", ".jpg", ".jpeg", ".ico", ".gif",
         ".wbmp", ".png", NULL};
      int i;


      for (i = 0; extensions[i]; i++) {
         success |= al_register_bitmap_loader(extensions[i], _al_load_android_bitmap);
         success |= al_register_bitmap_loader_f(extensions[i], _al_load_android_bitmap_f);
         //success |= al_register_bitmap_saver(extensions[i], _al_save_android_bitmap);
      }
      success |= al_register_bitmap_identifier(".webp", _al_identify_webp);
   }
#endif

#ifdef ALLEGRO_CFG_WANT_NATIVE_IMAGE_LOADER
#ifdef ALLEGRO_IPHONE
   {
      char const *extensions[] = {".tif", ".tiff", ".jpg", ".jpeg", ".gif",
         ".png", ".BMPf", ".ico", ".cur", ".xbm", NULL};
      int i;
      for (i = 0; extensions[i]; i++) {
         success |= al_register_bitmap_loader(extensions[i], _al_iphone_load_image);
         success |= al_register_bitmap_loader_f(extensions[i], _al_iphone_load_image_f);
      }
   }
#endif

#ifdef ALLEGRO_MACOSX
   success |= _al_osx_register_image_loader();
#endif
#endif

   if (success)
      iio_inited = true;

   _al_add_exit_func(al_shutdown_image_addon, "al_shutdown_image_addon");

   return success;
}